

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWSLoader.cpp
# Opt level: O3

void __thiscall
Assimp::LWSImporter::InternReadFile
          (LWSImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  byte *pbVar1;
  size_t *psVar2;
  _Base_ptr *pp_Var3;
  undefined8 *puVar4;
  double dVar5;
  undefined8 *puVar6;
  _List_node_base *p_Var7;
  pointer __src;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  long lVar12;
  Logger *pLVar13;
  _Rb_tree_header *p_Var14;
  _Node *p_Var15;
  _List_node_base *p_Var16;
  aiScene *this_00;
  aiNode *this_01;
  aiNode **ppaVar17;
  aiNode *this_02;
  aiAnimation **ppaVar18;
  aiAnimation *paVar19;
  aiNodeAnim **__dest;
  runtime_error *prVar20;
  long *plVar21;
  char cVar22;
  uint uVar23;
  undefined1 *puVar24;
  _func_int **pp_Var25;
  long *plVar26;
  byte bVar27;
  uint uVar28;
  char *pcVar29;
  undefined7 uVar31;
  LWSImporter *pLVar30;
  ulong in_R8;
  ulong __n;
  LWSImporter *dad;
  ulong uVar32;
  _List_node_base *p_Var33;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar34;
  FlipWindingOrderProcess flipper;
  list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_> nodes;
  PropertyMap props;
  uint local_200;
  uint local_1fc;
  BatchLoader batch;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims;
  aiCamera **cams;
  const_iterator local_1b8;
  aiScene *pScene_local;
  int local_1a4;
  ulong local_1a0;
  ulong local_198;
  aiLight **lights;
  MakeLeftHandedProcess monster_cheat;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> attach;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  long local_140;
  uint local_138;
  char *local_130;
  _List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> local_128;
  undefined1 auStack_110 [16];
  undefined1 local_100 [16];
  undefined8 local_f0;
  undefined8 local_e8;
  _List_node_base local_e0;
  char local_d0 [24];
  vector<char,_std::allocator<char>_> mBuffer;
  char *local_98;
  char *dummy;
  Element root;
  IOStream *stream;
  
  this->io = pIOHandler;
  pp_Var3 = &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  props.ints._M_t._M_impl._0_8_ = pp_Var3;
  pScene_local = pScene;
  std::__cxx11::string::_M_construct<char_const*>((string *)&props,"rb","");
  iVar8 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,props.ints._M_t._M_impl._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var,iVar8);
  if ((_Base_ptr *)props.ints._M_t._M_impl._0_8_ != pp_Var3) {
    operator_delete((void *)props.ints._M_t._M_impl._0_8_,
                    (ulong)((long)&(props.ints._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  if (stream == (IOStream *)0x0) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&attach,
                   "Failed to open LWS file ",pFile);
    plVar21 = (long *)std::__cxx11::string::append((char *)&attach);
    props.ints._M_t._M_impl._0_8_ = *plVar21;
    plVar26 = plVar21 + 2;
    if ((long *)props.ints._M_t._M_impl._0_8_ == plVar26) {
      props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar26;
      props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar21[3];
      props.ints._M_t._M_impl._0_8_ =
           &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
    else {
      props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar26;
    }
    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar21[1];
    *plVar21 = (long)plVar26;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    std::runtime_error::runtime_error(prVar20,(string *)&props);
    *(undefined ***)prVar20 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar20,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(stream,&mBuffer,FORBID_EMPTY);
  lVar12 = 0x10;
  do {
    puVar24 = (undefined1 *)((long)&root.tokens[0]._M_dataplus._M_p + lVar12);
    *(undefined1 **)((long)&local_98 + lVar12) = puVar24;
    *(undefined8 *)((long)root.tokens + lVar12 + -8) = 0;
    *puVar24 = 0;
    lVar12 = lVar12 + 0x20;
  } while (lVar12 != 0x50);
  root.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&root.children;
  root.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
  _M_impl._M_node._M_size = 0;
  dummy = mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start;
  root.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       root.children.super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  LWS::Element::Parse(&root,&dummy);
  BatchLoader::BatchLoader(&batch,pIOHandler,false);
  p_Var33 = root.children.
            super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl.
            _M_node.super__List_node_base._M_next;
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node._M_size = 0;
  p_Var16 = root.children.
            super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>._M_impl.
            _M_node.super__List_node_base._M_next + 1;
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&nodes;
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&nodes;
  iVar8 = std::__cxx11::string::compare((char *)p_Var16);
  iVar9 = std::__cxx11::string::compare((char *)p_Var16);
  local_1a4 = iVar8;
  if ((iVar8 != 0) && (iVar9 != 0)) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    props.ints._M_t._M_impl._0_8_ = pp_Var3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&props,"LWS: Not a LightWave scene, magic tag LWSC not found","");
    std::runtime_error::runtime_error(prVar20,(string *)&props);
    *(undefined ***)prVar20 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar20,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var16 = p_Var33->_M_next;
  p_Var33 = p_Var16[1]._M_next;
  cVar22 = *(char *)&p_Var33->_M_next;
  uVar28 = 0;
  if (0xf5 < (byte)(cVar22 - 0x3aU)) {
    uVar28 = 0;
    do {
      p_Var33 = (_List_node_base *)((long)&p_Var33->_M_next + 1);
      uVar28 = (uint)(byte)(cVar22 - 0x30) + uVar28 * 10;
      cVar22 = *(char *)&p_Var33->_M_next;
    } while (0xf5 < (byte)(cVar22 - 0x3aU));
  }
  local_1b8._M_node = p_Var16;
  pLVar13 = DefaultLogger::get();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&props,
                 "LWS file format version is ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var16 + 1))
  ;
  Logger::info(pLVar13,(char *)props.ints._M_t._M_impl._0_8_);
  if ((_Base_ptr *)props.ints._M_t._M_impl._0_8_ != pp_Var3) {
    operator_delete((void *)props.ints._M_t._M_impl._0_8_,
                    (ulong)((long)&(props.ints._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  *(undefined4 *)&this->first = 0;
  *(undefined4 *)((long)&this->first + 4) = 0;
  *(undefined4 *)&this->last = 0;
  *(undefined4 *)((long)&this->last + 4) = 0x404e0000;
  this->fps = 25.0;
  if (p_Var16 == (_List_node_base *)&root.children) {
    local_1fc = 0;
    local_200 = 0;
    p_Var7 = nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    p_Var33 = nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
              _M_impl._M_node.super__List_node_base._M_next;
joined_r0x00455c3f:
    for (; nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
           _M_impl._M_node.super__List_node_base._M_next = p_Var33,
        p_Var7 != (_List_node_base *)&nodes; p_Var7 = p_Var7->_M_next) {
      if (p_Var33 != (_List_node_base *)&nodes) {
        do {
          if ((((p_Var33 != p_Var7) && (uVar28 = *(uint *)&p_Var33[4]._M_next, uVar28 != 0)) &&
              (uVar28 >> 0x1c == *(uint *)&p_Var7[1]._M_next)) &&
             ((uVar28 & 0xfffffff) == *(uint *)((long)&p_Var7[3]._M_prev + 4))) {
            if (p_Var33[0xb]._M_next == (_List_node_base *)0x0) {
              p_Var16 = (_List_node_base *)operator_new(0x18);
              p_Var16[1]._M_next = p_Var33 + 1;
              std::__detail::_List_node_base::_M_hook(p_Var16);
              p_Var7[10]._M_prev = (_List_node_base *)((long)&(p_Var7[10]._M_prev)->_M_next + 1);
              p_Var33[0xb]._M_next = p_Var7 + 1;
            }
            else {
              pLVar13 = DefaultLogger::get();
              Logger::error(pLVar13,"LWS: Found cross reference in scene-graph");
            }
          }
          p_Var33 = p_Var33->_M_next;
        } while (p_Var33 != (_List_node_base *)&nodes);
      }
      p_Var33 = nodes.
                super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                _M_impl._M_node.super__List_node_base._M_next;
    }
    if (p_Var33 != (_List_node_base *)&nodes) {
      uVar28 = 0;
      do {
        p_Var16 = p_Var33 + 0xb;
        p_Var33 = p_Var33->_M_next;
        uVar28 = uVar28 + (p_Var16->_M_next == (_List_node_base *)0x0);
      } while (p_Var33 != (_List_node_base *)&nodes);
      if (uVar28 != 0) {
        BatchLoader::LoadAll(&batch);
        this_00 = (aiScene *)operator_new(0x80);
        aiScene::aiScene(this_00);
        this_01 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(this_01);
        this_00->mRootNode = this_01;
        if (local_1fc == 0) {
          cams = this_00->mCameras;
        }
        else {
          this_00->mNumCameras = local_1fc;
          cams = (aiCamera **)operator_new__((ulong)local_1fc << 3);
          this_00->mCameras = cams;
        }
        if (local_200 == 0) {
          lights = this_00->mLights;
        }
        else {
          this_00->mNumLights = local_200;
          lights = (aiLight **)operator_new__((ulong)local_200 << 3);
          this_00->mLights = lights;
        }
        attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (this_01->mName).length = 9;
        builtin_strncpy((this_01->mName).data,"<LWSRoot>",10);
        ppaVar17 = (aiNode **)operator_new__((ulong)uVar28 << 3);
        this_01->mChildren = ppaVar17;
        if (nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
            _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes) {
          p_Var16 = nodes.
                    super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                    _M_impl._M_node.super__List_node_base._M_next;
          do {
            if (p_Var16[0xb]._M_next == (_List_node_base *)0x0) {
              this_02 = (aiNode *)operator_new(0x478);
              aiNode::aiNode(this_02);
              uVar28 = this_01->mNumChildren;
              this_01->mNumChildren = uVar28 + 1;
              this_01->mChildren[uVar28] = this_02;
              this_02->mParent = this_01;
              BuildGraph(this,this_02,(NodeDesc *)(p_Var16 + 1),&attach,&batch,&cams,&lights,&anims)
              ;
            }
            __src = anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
            p_Var16 = p_Var16->_M_next;
          } while (p_Var16 != (_List_node_base *)&nodes);
          uVar32 = (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          __n = (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          if (__n != 0) {
            this_00->mNumAnimations = 1;
            ppaVar18 = (aiAnimation **)operator_new__(8);
            this_00->mAnimations = ppaVar18;
            paVar19 = (aiAnimation *)operator_new(0x448);
            memset((paVar19->mName).data + 0xe,0x1b,0x3f2);
            paVar19->mChannels = (aiNodeAnim **)0x0;
            paVar19->mNumMeshChannels = 0;
            paVar19->mMeshChannels = (aiMeshAnim **)0x0;
            paVar19->mNumMorphMeshChannels = 0;
            paVar19->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
            *ppaVar18 = paVar19;
            (paVar19->mName).length = 0xd;
            builtin_strncpy((paVar19->mName).data,"LWSMasterAnim",0xe);
            paVar19->mTicksPerSecond = this->fps;
            paVar19->mDuration = this->last - (this->first + -1.0);
            paVar19->mNumChannels = (uint)(uVar32 >> 3);
            __dest = (aiNodeAnim **)operator_new__(__n & 0x7fffffff8);
            paVar19->mChannels = __dest;
            memmove(__dest,__src,__n);
          }
        }
        MakeLeftHandedProcess::MakeLeftHandedProcess(&monster_cheat);
        MakeLeftHandedProcess::Execute(&monster_cheat,this_00);
        FlipWindingOrderProcess::FlipWindingOrderProcess(&flipper);
        FlipWindingOrderProcess::Execute(&flipper,this_00);
        uVar28 = 0x13;
        if (this->configSpeedFlag != false) {
          uVar28 = 1;
        }
        SceneCombiner::MergeScenes(&pScene_local,this_00,&attach,uVar28);
        if (((pScene_local->mNumMeshes == 0) || (pScene_local->mNumMaterials == 0)) &&
           ((*(byte *)&pScene_local->mFlags = (byte)pScene_local->mFlags | 1,
            pScene_local->mNumAnimations != 0 && (this->noSkeletonMesh == false)))) {
          SkeletonMeshBuilder::SkeletonMeshBuilder
                    ((SkeletonMeshBuilder *)&props,pScene_local,(aiNode *)0x0,false);
          if (props.floats._M_t._M_impl._0_8_ != 0) {
            operator_delete((void *)props.floats._M_t._M_impl._0_8_,
                            (long)props.floats._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_parent - props.floats._M_t._M_impl._0_8_);
          }
          if (props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left != (_Base_ptr)0x0) {
            operator_delete(props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                            props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count -
                            (long)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
          }
          if (props.ints._M_t._M_impl._0_8_ != 0) {
            operator_delete((void *)props.ints._M_t._M_impl._0_8_,
                            (long)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                            - props.ints._M_t._M_impl._0_8_);
          }
        }
        FlipWindingOrderProcess::~FlipWindingOrderProcess(&flipper);
        MakeLeftHandedProcess::~MakeLeftHandedProcess(&monster_cheat);
        if (anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)anims.
                                super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)anims.
                                super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (attach.
            super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(attach.
                          super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)attach.
                                super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)attach.
                                super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::__cxx11::_List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
        _M_clear(&nodes.
                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>);
        BatchLoader::~BatchLoader(&batch);
        std::__cxx11::_List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>::
        _M_clear(&root.children.
                  super__List_base<Assimp::LWS::Element,_std::allocator<Assimp::LWS::Element>_>);
        lVar12 = -0x40;
        paVar34 = &root.tokens[1].field_2;
        do {
          plVar21 = (long *)(((string *)(paVar34 + -1))->_M_dataplus)._M_p;
          if (paVar34 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar21) {
            operator_delete(plVar21,paVar34->_M_allocated_capacity + 1);
          }
          paVar34 = paVar34 + -2;
          lVar12 = lVar12 + 0x20;
        } while (lVar12 != 0);
        if (mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)mBuffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        (*stream->_vptr_IOStream[1])(stream);
        return;
      }
    }
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    props.ints._M_t._M_impl._0_8_ =
         &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&props,"LWS: Unable to find scene root node","");
    std::runtime_error::runtime_error(prVar20,(string *)&props);
    *(undefined ***)prVar20 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar20,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar2 = &props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var14 = &props.matrices._M_t._M_impl.super__Rb_tree_header;
  local_98 = local_d0;
  local_1a0 = 0;
  local_198 = 0;
  uVar11 = 0;
  local_200 = 0;
  local_1fc = 0;
LAB_004546f9:
  flipper.super_BaseProcess._vptr_BaseProcess = (_func_int **)p_Var16[3]._M_next;
  dad = (LWSImporter *)(p_Var16 + 1);
  iVar8 = std::__cxx11::string::compare((char *)dad);
  if (iVar8 != 0) {
    iVar8 = std::__cxx11::string::compare((char *)dad);
    if (iVar8 == 0) {
      if ((this->last != 150392.0) || (NAN(this->last))) {
        cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
        dVar5 = -1.0;
        if (0xf5 < (byte)(cVar22 - 0x3aU)) {
          uVar23 = 0;
          pp_Var25 = flipper.super_BaseProcess._vptr_BaseProcess;
          do {
            pp_Var25 = (_func_int **)((long)pp_Var25 + 1);
            uVar23 = (uint)(byte)(cVar22 - 0x30) + uVar23 * 10;
            cVar22 = *(char *)pp_Var25;
          } while (0xf5 < (byte)(cVar22 - 0x3aU));
          dVar5 = (double)uVar23 + -1.0;
        }
        this->last = dVar5;
      }
      goto LAB_0045519b;
    }
    iVar8 = std::__cxx11::string::compare((char *)dad);
    if (iVar8 == 0) {
      cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
      dVar5 = 0.0;
      if (0xf5 < (byte)(cVar22 - 0x3aU)) {
        uVar23 = 0;
        pp_Var25 = flipper.super_BaseProcess._vptr_BaseProcess;
        do {
          pp_Var25 = (_func_int **)((long)pp_Var25 + 1);
          uVar23 = (uint)(byte)(cVar22 - 0x30) + uVar23 * 10;
          cVar22 = *(char *)pp_Var25;
        } while (0xf5 < (byte)(cVar22 - 0x3aU));
        dVar5 = (double)uVar23;
      }
      this->fps = dVar5;
      goto LAB_0045519b;
    }
    iVar8 = std::__cxx11::string::compare((char *)dad);
    if (iVar8 == 0) {
      cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
      iVar8 = 0;
      if (0xf5 < (byte)(cVar22 - 0x3aU)) {
        iVar8 = 0;
        do {
          iVar8 = (uint)(byte)(cVar22 - 0x30) + iVar8 * 10;
          cVar22 = *(char *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
          flipper.super_BaseProcess._vptr_BaseProcess =
               (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
        } while (0xf5 < (byte)(cVar22 - 0x3aU));
      }
      cams = (aiCamera **)CONCAT44(cams._4_4_,iVar8);
      props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &props.ints._M_t._M_impl.super__Rb_tree_header._M_header;
      props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &props.floats._M_t._M_impl.super__Rb_tree_header._M_header;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           props.strings._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &props.strings._M_t._M_impl.super__Rb_tree_header._M_header;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      props.matrices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var14->_M_header;
      props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var14->_M_header;
      SetGenericProperty<int>(&props.ints,"IMPORT_LWO_ONE_LAYER_ONLY",(int *)&cams);
      attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_150;
      attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_150._M_local_buf[0] = '\0';
      local_138 = 0;
      local_130 = "";
      local_128._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_128;
      auStack_110._8_4_ = 0.0;
      auStack_110[0xc] = false;
      local_128._M_impl._M_node._M_size = 0;
      auStack_110._0_5_ = 0;
      auStack_110._5_3_ = 0;
      local_100._0_4_ = 1.0;
      local_100._4_4_ = 1.0;
      local_100._8_4_ = 1.0;
      local_100._12_4_ = 1.0;
      local_f0._0_4_ = 0;
      local_f0._4_4_ = 0;
      local_e8._0_4_ = 45.0;
      local_e8._4_4_ = 0.0;
      local_e0._M_next = &local_e0;
      pcVar29 = local_98;
      pcVar29[0] = '\0';
      pcVar29[1] = '\0';
      pcVar29[2] = '\0';
      pcVar29[3] = '\0';
      pcVar29[4] = '\0';
      pcVar29[5] = '\0';
      pcVar29[6] = '\0';
      pcVar29[7] = '\0';
      pcVar29[8] = '\0';
      pcVar29[9] = '\0';
      pcVar29[10] = '\0';
      pcVar29[0xb] = '\0';
      pcVar29[0xc] = '\0';
      pcVar29[0xd] = '\0';
      pcVar29[0xe] = '\0';
      pcVar29[0xf] = '\0';
      attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(attach.
                             super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
      if (3 < uVar28) {
        for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
               (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
            flipper.super_BaseProcess._vptr_BaseProcess =
                 (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
        }
        uVar23 = 0;
        do {
          cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
          if ((byte)(cVar22 - 0x30U) < 10) {
            uVar23 = uVar23 << 4 | (uint)(byte)(cVar22 - 0x30U);
          }
          else {
            bVar27 = cVar22 + 0xbf;
            if ((5 < bVar27) && (bVar27 = cVar22 + 0x9f, 5 < bVar27)) goto LAB_00454d50;
            uVar23 = uVar23 * 0x10 + (uint)bVar27 + 10;
          }
          flipper.super_BaseProcess._vptr_BaseProcess =
               (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
        } while( true );
      }
      uVar23 = uVar11 + 1;
      uVar10 = uVar11;
      goto LAB_00454d5a;
    }
    iVar8 = std::__cxx11::string::compare((char *)dad);
    uVar23 = uVar11;
    if (iVar8 == 0) {
      props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)
           ((ulong)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
           0xffffffffffffff00);
      props.floats._M_t._M_impl._0_8_ = props.floats._M_t._M_impl._0_8_ & 0xffffffff00000000;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = (long)"\x05\x05\x04" + 3;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)&props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      props.strings._M_t._M_impl._0_5_ = 0;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
      props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x3f800000;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x3f8000003f800000;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x42340000;
      props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)&props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
      props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      props.ints._M_t._M_impl._0_4_ = 1;
      if (3 < uVar28) {
        uVar11 = 0;
        do {
          cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
          if ((byte)(cVar22 - 0x30U) < 10) {
            uVar11 = uVar11 << 4 | (uint)(byte)(cVar22 - 0x30U);
          }
          else {
            bVar27 = cVar22 + 0xbf;
            if ((5 < bVar27) && (bVar27 = cVar22 + 0x9f, 5 < bVar27)) goto LAB_00454ff1;
            uVar11 = uVar11 * 0x10 + (uint)bVar27 + 10;
          }
          flipper.super_BaseProcess._vptr_BaseProcess =
               (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
        } while( true );
      }
      uVar23 = uVar11 + 1;
      goto LAB_00455016;
    }
    iVar8 = std::__cxx11::string::compare((char *)dad);
    if (iVar8 != 0) {
      iVar8 = std::__cxx11::string::compare((char *)dad);
      if (iVar8 != 0) {
        iVar8 = std::__cxx11::string::compare((char *)dad);
        if (iVar8 == 0) {
          if (nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
              _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) {
            if (local_1a4 == 0) {
              props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   (_Base_ptr)
                   ((ulong)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
                   0xffffffffffffff00);
              props.floats._M_t._M_impl._0_8_ = props.floats._M_t._M_impl._0_8_ & 0xffffffff00000000
              ;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)&props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              props.strings._M_t._M_impl._0_5_ = 0;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x3f800000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x3f8000003f800000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   (_Base_ptr)0x42340000;
              props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   (size_t)&props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
              props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
              ;
              props.ints._M_t._M_impl._0_4_ = 1;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   flipper.super_BaseProcess._vptr_BaseProcess;
              props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = (ulong)uVar11 << 0x20;
              props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              props.matrices._M_t._M_impl._0_8_ = psVar2;
              p_Var15 = std::__cxx11::
                        list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>>::
                        _M_create_node<Assimp::LWS::NodeDesc_const&>
                                  ((list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>>
                                    *)&nodes,(NodeDesc *)&props);
              std::__detail::_List_node_base::_M_hook(&p_Var15->super__List_node_base);
              nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
              _M_impl._M_node._M_size =
                   nodes.
                   super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                   _M_impl._M_node._M_size + 1;
              puVar6 = (undefined8 *)props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
              while (puVar6 != psVar2) {
                puVar4 = (undefined8 *)*puVar6;
                operator_delete(puVar6,0x18);
                puVar6 = puVar4;
              }
              std::__cxx11::
              _List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::_M_clear
                        ((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>
                          *)&props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
              if ((_Base_ptr *)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ !=
                  &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
                operator_delete((void *)props.ints._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _0_8_,
                                (ulong)((long)&(props.ints._M_t._M_impl.super__Rb_tree_header.
                                                _M_header._M_left)->_M_color + 1));
              }
              uVar11 = uVar11 + 1;
            }
            pLVar13 = DefaultLogger::get();
            Logger::error(pLVar13,"LWS: Unexpected keyword: \'Channel\'");
          }
          props.ints._M_t._M_impl._0_8_ = 0x1000000000;
          props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
          props.ints._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
          props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
          props.floats._M_t._M_impl._0_8_ = 0;
          std::__cxx11::list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::
          _M_insert<Assimp::LWO::Envelope>
                    ((list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
                     (nodes.
                      super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                      ._M_impl._M_node.super__List_node_base._M_prev + 5),
                     (iterator)
                     (nodes.
                      super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                      ._M_impl._M_node.super__List_node_base._M_prev + 5),(Envelope *)&props);
          if (props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
            operator_delete(props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                            (long)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_right -
                            (long)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
            ;
          }
          p_Var16 = nodes.
                    super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                    _M_impl._M_node.super__List_node_base._M_prev[5]._M_prev;
          cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
          iVar8 = 0;
          if (0xf5 < (byte)(cVar22 - 0x3aU)) {
            iVar8 = 0;
            pp_Var25 = flipper.super_BaseProcess._vptr_BaseProcess;
            do {
              pp_Var25 = (_func_int **)((long)pp_Var25 + 1);
              iVar8 = (uint)(byte)(cVar22 - 0x30) + iVar8 * 10;
              cVar22 = *(char *)pp_Var25;
            } while (0xf5 < (byte)(cVar22 - 0x3aU));
          }
          *(int *)&p_Var16[1]._M_next = iVar8;
          *(int *)((long)&p_Var16[1]._M_next + 4) = iVar8 + 1;
        }
        else {
          pLVar30 = dad;
          iVar8 = std::__cxx11::string::compare((char *)dad);
          if (iVar8 == 0) {
            if ((nodes.
                 super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                 _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) ||
               (nodes.
                super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                _M_impl._M_node.super__List_node_base._M_prev[5]._M_next ==
                nodes.
                super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                _M_impl._M_node.super__List_node_base._M_prev + 5)) {
              pLVar13 = DefaultLogger::get();
              pcVar29 = "LWS: Unexpected keyword: \'Envelope\'";
              goto LAB_00455bb5;
            }
            ReadEnvelope(pLVar30,(Element *)dad,
                         (Envelope *)
                         (nodes.
                          super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                          ._M_impl._M_node.super__List_node_base._M_prev[5]._M_prev + 1));
          }
          else if (uVar28 < 3) {
            pLVar30 = dad;
            iVar8 = std::__cxx11::string::compare((char *)dad);
            if (((iVar8 == 0) ||
                (pLVar30 = dad, iVar8 = std::__cxx11::string::compare((char *)dad), iVar8 == 0)) ||
               (pLVar30 = dad, iVar8 = std::__cxx11::string::compare((char *)dad), iVar8 == 0)) {
              if (nodes.
                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                  _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) {
                pLVar13 = DefaultLogger::get();
                pcVar29 = "LWS: Unexpected keyword: \'<Light|Object|Camera>Motion\'";
                goto LAB_00455bb5;
              }
              props.ints._M_t._M_impl._0_8_ = &root.children;
              ReadEnvelope_Old(pLVar30,&local_1b8,(const_iterator *)&props,
                               (NodeDesc *)
                               (nodes.
                                super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                ._M_impl._M_node.super__List_node_base._M_prev + 1),(uint)in_R8);
            }
            else if ((uVar28 == 2) &&
                    (pLVar30 = dad, iVar8 = std::__cxx11::string::compare((char *)dad), iVar8 == 0))
            {
              if (nodes.
                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                  _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) {
                pLVar13 = DefaultLogger::get();
                pcVar29 = "LWS: Unexpected keyword: \'Pre/PostBehavior\'";
                goto LAB_00455bb5;
              }
              for (p_Var16 = nodes.
                             super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                             ._M_impl._M_node.super__List_node_base._M_prev[5]._M_next;
                  p_Var16 !=
                  nodes.
                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                  _M_impl._M_node.super__List_node_base._M_prev + 5; p_Var16 = p_Var16->_M_next) {
                cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
                uVar31 = (undefined7)((ulong)pLVar30 >> 8);
                iVar8 = 0;
                if (0xf5 < (byte)(cVar22 - 0x3aU)) {
                  iVar8 = 0;
                  do {
                    iVar8 = (uint)(byte)(cVar22 - 0x30) + iVar8 * 10;
                    cVar22 = *(char *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                    uVar31 = 0;
                    flipper.super_BaseProcess._vptr_BaseProcess =
                         (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                  } while (0xf5 < (byte)(cVar22 - 0x3aU));
                }
                *(int *)&p_Var16[1]._M_prev = iVar8;
                for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
                       (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
                    flipper.super_BaseProcess._vptr_BaseProcess =
                         (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
                }
                pLVar30 = (LWSImporter *)
                          CONCAT71(uVar31,*(char *)flipper.super_BaseProcess._vptr_BaseProcess);
                uVar23 = (int)pLVar30 - 0x3a;
                iVar8 = 0;
                if (0xf5 < (byte)uVar23) {
                  iVar8 = 0;
                  do {
                    iVar8 = (uint)(byte)((char)pLVar30 - 0x30) + iVar8 * 10;
                    pbVar1 = (byte *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                    pLVar30 = (LWSImporter *)(ulong)*pbVar1;
                    flipper.super_BaseProcess._vptr_BaseProcess =
                         (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                    uVar23 = *pbVar1 - 0x3a;
                  } while (0xf5 < (byte)uVar23);
                }
                in_R8 = (ulong)uVar23;
                *(int *)((long)&p_Var16[1]._M_prev + 4) = iVar8;
                for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
                       (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
                    flipper.super_BaseProcess._vptr_BaseProcess =
                         (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
                }
              }
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)dad);
              if (iVar8 == 0) goto LAB_004555a5;
              iVar8 = std::__cxx11::string::compare((char *)dad);
              if (iVar8 != 0) goto LAB_004553fb;
              if (nodes.
                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                  _M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes) {
                pLVar13 = DefaultLogger::get();
                pcVar29 = "LWS: Unexpected keyword: \'ParentObject\'";
                goto LAB_00455bb5;
              }
              cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
              uVar23 = 0x10000000;
              if (0xf5 < (byte)(cVar22 - 0x3aU)) {
                uVar23 = 0;
                do {
                  uVar23 = (uint)(byte)(cVar22 - 0x30) + uVar23 * 10;
                  cVar22 = *(char *)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                  flipper.super_BaseProcess._vptr_BaseProcess =
                       (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
                } while (0xf5 < (byte)(cVar22 - 0x3aU));
                uVar23 = uVar23 | 0x10000000;
              }
              *(uint *)&nodes.
                        super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                        ._M_impl._M_node.super__List_node_base._M_prev[4]._M_next = uVar23;
            }
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)dad);
            if (iVar8 == 0) {
LAB_004555a5:
              if (nodes.
                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                  _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes) {
                uVar23 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                   (char **)&flipper);
                *(uint *)&nodes.
                          super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                          ._M_impl._M_node.super__List_node_base._M_prev[4]._M_next = uVar23;
                goto LAB_0045519b;
              }
              pLVar13 = DefaultLogger::get();
              pcVar29 = "LWS: Unexpected keyword: \'ParentItem\'";
            }
            else {
LAB_004553fb:
              iVar8 = std::__cxx11::string::compare((char *)dad);
              if (iVar8 == 0) {
                props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     (_Base_ptr)
                     ((ulong)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
                     0xffffffffffffff00);
                props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                props.floats._M_t._M_impl._0_8_ =
                     props.floats._M_t._M_impl._0_8_ & 0xffffffff00000000;
                props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     (long)"\x05\x05\x04" + 3;
                props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)&props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                ;
                props.strings._M_t._M_impl._0_5_ = 0;
                props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
                props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
                props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
                props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x3f800000;
                props.strings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
                props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x3f8000003f800000;
                props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
                props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     (_Base_ptr)0x42340000;
                props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     (size_t)&props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
                props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x0;
                props.ints._M_t._M_impl._0_4_ = 3;
                props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                if (uVar28 < 4) {
                  uVar23 = (uint)local_198;
                  local_198 = (ulong)(uVar23 + 1);
                  props.matrices._M_t._M_impl._0_8_ = psVar2;
                }
                else {
                  props.matrices._M_t._M_impl._0_8_ = psVar2;
                  uVar23 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                     (char **)&flipper);
                  uVar23 = uVar23 & 0xfffffff;
                }
                props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     CONCAT44(uVar23,(undefined4)
                                     props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count);
                std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>::
                push_back(&nodes,(value_type *)&props);
                local_1fc = local_1fc + 1;
LAB_00455869:
                LWS::NodeDesc::~NodeDesc((NodeDesc *)&props);
                goto LAB_0045519b;
              }
              iVar8 = std::__cxx11::string::compare((char *)dad);
              if (iVar8 == 0) {
                if ((nodes.
                     super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                     ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes) &&
                   (*(int *)&nodes.
                             super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                             ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next == 3)) {
LAB_0045582c:
                  nodes.
                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
                  _M_impl._M_node.super__List_node_base._M_prev[4]._M_prev =
                       (_List_node_base *)flipper.super_BaseProcess._vptr_BaseProcess;
                  goto LAB_0045519b;
                }
                pLVar13 = DefaultLogger::get();
                pcVar29 = "LWS: Unexpected keyword: \'CameraName\'";
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)dad);
                if (iVar8 == 0) {
                  props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
                  ;
                  props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       (_Base_ptr)
                       ((ulong)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
                       0xffffffffffffff00);
                  props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  props.floats._M_t._M_impl._0_8_ =
                       props.floats._M_t._M_impl._0_8_ & 0xffffffff00000000;
                  props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                       (long)"\x05\x05\x04" + 3;
                  props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)
                       &props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  props.strings._M_t._M_impl._0_5_ = 0;
                  props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       (_Base_ptr)0x0;
                  props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
                  props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
                  props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x3f800000;
                  props.strings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
                  props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)0x3f8000003f800000;
                  props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       (_Base_ptr)0x0;
                  props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       (_Base_ptr)0x42340000;
                  props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       (size_t)&props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
                  props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)0x0;
                  props.ints._M_t._M_impl._0_4_ = 2;
                  props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                  if (uVar28 < 4) {
                    uVar23 = (uint)local_1a0;
                    local_1a0 = (ulong)(uVar23 + 1);
                    props.matrices._M_t._M_impl._0_8_ = psVar2;
                  }
                  else {
                    props.matrices._M_t._M_impl._0_8_ = psVar2;
                    uVar23 = strtoul16((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                       (char **)&flipper);
                    uVar23 = uVar23 & 0xfffffff;
                  }
                  props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count =
                       CONCAT44(uVar23,(undefined4)
                                       props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count);
                  std::__cxx11::list<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                  ::push_back(&nodes,(value_type *)&props);
                  local_200 = local_200 + 1;
                  goto LAB_00455869;
                }
                iVar8 = std::__cxx11::string::compare((char *)dad);
                if (iVar8 != 0) {
                  iVar8 = std::__cxx11::string::compare((char *)dad);
                  if ((iVar8 == 0) ||
                     (iVar8 = std::__cxx11::string::compare((char *)dad), iVar8 == 0)) {
                    if ((nodes.
                         super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                         ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&nodes
                        ) || (*(int *)&nodes.
                                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                       ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next !=
                              2)) {
                      pLVar13 = DefaultLogger::get();
                      pcVar29 = "LWS: Unexpected keyword: \'LightIntensity\'";
                      goto LAB_00455bb5;
                    }
                    fast_atoreal_move<float>
                              ((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                               (float *)((long)&nodes.
                                                super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                ._M_impl._M_node.super__List_node_base._M_prev[8].
                                                _M_next + 4),true);
                  }
                  else {
                    iVar8 = std::__cxx11::string::compare((char *)dad);
                    if (iVar8 == 0) {
                      if ((nodes.
                           super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                           ._M_impl._M_node.super__List_node_base._M_next ==
                           (_List_node_base *)&nodes) ||
                         (*(int *)&nodes.
                                   super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                   ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next != 2))
                      {
                        pLVar13 = DefaultLogger::get();
                        pcVar29 = "LWS: Unexpected keyword: \'LightType\'";
                        goto LAB_00455bb5;
                      }
                      cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
                      iVar8 = 0;
                      if (0xf5 < (byte)(cVar22 - 0x3aU)) {
                        iVar8 = 0;
                        pp_Var25 = flipper.super_BaseProcess._vptr_BaseProcess;
                        do {
                          pp_Var25 = (_func_int **)((long)pp_Var25 + 1);
                          iVar8 = (uint)(byte)(cVar22 - 0x30) + iVar8 * 10;
                          cVar22 = *(char *)pp_Var25;
                        } while (0xf5 < (byte)(cVar22 - 0x3aU));
                      }
                      *(int *)&nodes.
                               super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                               ._M_impl._M_node.super__List_node_base._M_prev[8]._M_prev = iVar8;
                    }
                    else {
                      iVar8 = std::__cxx11::string::compare((char *)dad);
                      if (iVar8 == 0) {
                        if ((nodes.
                             super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                             ._M_impl._M_node.super__List_node_base._M_next ==
                             (_List_node_base *)&nodes) ||
                           (*(int *)&nodes.
                                     super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                     ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next != 2)
                           ) {
                          pLVar13 = DefaultLogger::get();
                          pcVar29 = "LWS: Unexpected keyword: \'LightFalloffType\'";
                          goto LAB_00455bb5;
                        }
                        cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
                        iVar8 = 0;
                        if (0xf5 < (byte)(cVar22 - 0x3aU)) {
                          iVar8 = 0;
                          pp_Var25 = flipper.super_BaseProcess._vptr_BaseProcess;
                          do {
                            pp_Var25 = (_func_int **)((long)pp_Var25 + 1);
                            iVar8 = (uint)(byte)(cVar22 - 0x30) + iVar8 * 10;
                            cVar22 = *(char *)pp_Var25;
                          } while (0xf5 < (byte)(cVar22 - 0x3aU));
                        }
                        *(int *)((long)&nodes.
                                        super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                        ._M_impl._M_node.super__List_node_base._M_prev[8]._M_prev +
                                4) = iVar8;
                      }
                      else {
                        iVar8 = std::__cxx11::string::compare((char *)dad);
                        if (iVar8 == 0) {
                          if ((nodes.
                               super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                               ._M_impl._M_node.super__List_node_base._M_next ==
                               (_List_node_base *)&nodes) ||
                             (*(int *)&nodes.
                                       super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                       ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next !=
                              2)) {
                            pLVar13 = DefaultLogger::get();
                            pcVar29 = "LWS: Unexpected keyword: \'LightConeAngle\'";
                            goto LAB_00455bb5;
                          }
                          props.ints._M_t._M_impl._0_8_ =
                               props.ints._M_t._M_impl._0_8_ & 0xffffffff00000000;
                          fast_atoreal_move<float>
                                    ((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                     (float *)&props,true);
                          *(undefined4 *)
                           &nodes.
                            super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                            ._M_impl._M_node.super__List_node_base._M_prev[9]._M_next =
                               props.ints._M_t._M_impl._0_4_;
                        }
                        else {
                          iVar8 = std::__cxx11::string::compare((char *)dad);
                          if (iVar8 == 0) {
                            if ((nodes.
                                 super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                 ._M_impl._M_node.super__List_node_base._M_next ==
                                 (_List_node_base *)&nodes) ||
                               (*(int *)&nodes.
                                         super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next
                                != 2)) {
                              pLVar13 = DefaultLogger::get();
                              pcVar29 = "LWS: Unexpected keyword: \'LightEdgeAngle\'";
                              goto LAB_00455bb5;
                            }
                            props.ints._M_t._M_impl._0_8_ =
                                 props.ints._M_t._M_impl._0_8_ & 0xffffffff00000000;
                            fast_atoreal_move<float>
                                      ((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                       (float *)&props,true);
                            *(undefined4 *)
                             ((long)&nodes.
                                     super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                     ._M_impl._M_node.super__List_node_base._M_prev[9]._M_next + 4)
                                 = props.ints._M_t._M_impl._0_4_;
                          }
                          else {
                            iVar8 = std::__cxx11::string::compare((char *)dad);
                            if (iVar8 == 0) {
                              if ((nodes.
                                   super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                   ._M_impl._M_node.super__List_node_base._M_next ==
                                   (_List_node_base *)&nodes) ||
                                 (*(int *)&nodes.
                                           super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                           ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next
                                  != 2)) {
                                pLVar13 = DefaultLogger::get();
                                pcVar29 = "LWS: Unexpected keyword: \'LightColor\'";
                                goto LAB_00455bb5;
                              }
                              for (flipper.super_BaseProcess._vptr_BaseProcess =
                                        (_func_int **)
                                        fast_atoreal_move<float>
                                                  ((char *)flipper.super_BaseProcess.
                                                           _vptr_BaseProcess,
                                                   (float *)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[7].
                                                  _M_prev,true);
                                  (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
                                  (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
                                  flipper.super_BaseProcess._vptr_BaseProcess =
                                       (_func_int **)
                                       ((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
                              }
                              for (flipper.super_BaseProcess._vptr_BaseProcess =
                                        (_func_int **)
                                        fast_atoreal_move<float>
                                                  ((char *)flipper.super_BaseProcess.
                                                           _vptr_BaseProcess,
                                                   (float *)((long)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[7].
                                                  _M_prev + 4),true);
                                  (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
                                  (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
                                  flipper.super_BaseProcess._vptr_BaseProcess =
                                       (_func_int **)
                                       ((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
                              }
                              flipper.super_BaseProcess._vptr_BaseProcess =
                                   (_func_int **)
                                   fast_atoreal_move<float>
                                             ((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                              (float *)(nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev + 8
                                                  ),true);
                            }
                            else {
                              iVar8 = std::__cxx11::string::compare((char *)dad);
                              if ((iVar8 == 0) ||
                                 (iVar8 = std::__cxx11::string::compare((char *)dad), iVar8 == 0)) {
                                if (nodes.
                                    super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                    ._M_impl._M_node.super__List_node_base._M_next ==
                                    (_List_node_base *)&nodes) {
                                  pLVar13 = DefaultLogger::get();
                                  pcVar29 = "LWS: Unexpected keyword: \'PivotPosition\'";
                                  goto LAB_00455bb5;
                                }
                                for (flipper.super_BaseProcess._vptr_BaseProcess =
                                          (_func_int **)
                                          fast_atoreal_move<float>
                                                    ((char *)flipper.super_BaseProcess.
                                                             _vptr_BaseProcess,
                                                     (float *)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[6].
                                                  _M_prev,true);
                                    (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
                                    (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
                                    flipper.super_BaseProcess._vptr_BaseProcess =
                                         (_func_int **)
                                         ((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
                                }
                                for (flipper.super_BaseProcess._vptr_BaseProcess =
                                          (_func_int **)
                                          fast_atoreal_move<float>
                                                    ((char *)flipper.super_BaseProcess.
                                                             _vptr_BaseProcess,
                                                     (float *)((long)&nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev[6].
                                                  _M_prev + 4),true);
                                    (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
                                    (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
                                    flipper.super_BaseProcess._vptr_BaseProcess =
                                         (_func_int **)
                                         ((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
                                }
                                flipper.super_BaseProcess._vptr_BaseProcess =
                                     (_func_int **)
                                     fast_atoreal_move<float>
                                               ((char *)flipper.super_BaseProcess._vptr_BaseProcess,
                                                (float *)(nodes.
                                                  super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                                  ._M_impl._M_node.super__List_node_base._M_prev + 7
                                                  ),true);
                                *(undefined1 *)
                                 ((long)&nodes.
                                         super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                                         ._M_impl._M_node.super__List_node_base._M_prev[7]._M_next +
                                 4) = 1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_0045519b;
                }
                if ((nodes.
                     super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                     ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&nodes) &&
                   (*(int *)&nodes.
                             super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>
                             ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next == 2))
                goto LAB_0045582c;
                pLVar13 = DefaultLogger::get();
                pcVar29 = "LWS: Unexpected keyword: \'LightName\'";
              }
            }
LAB_00455bb5:
            Logger::error(pLVar13,pcVar29);
          }
        }
      }
      goto LAB_0045519b;
    }
    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
         0xffffffffffffff00);
    props.floats._M_t._M_impl._0_8_ = props.floats._M_t._M_impl._0_8_ & 0xffffffff00000000;
    props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    props.strings._M_t._M_impl._0_5_ = 0;
    props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._0_5_ = 0;
    props.floats._M_t._M_impl.super__Rb_tree_header._M_node_count._5_3_ = 0;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x3f800000;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x3f800000;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x3f8000003f800000;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x42340000;
    props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)&props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
    props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    props.matrices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    props.ints._M_t._M_impl._0_4_ = 1;
    if (3 < uVar28) {
      uVar11 = 0;
      do {
        cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
        if ((byte)(cVar22 - 0x30U) < 10) {
          uVar11 = uVar11 << 4 | (uint)(byte)(cVar22 - 0x30U);
        }
        else {
          bVar27 = cVar22 + 0xbf;
          if ((5 < bVar27) && (bVar27 = cVar22 + 0x9f, 5 < bVar27)) goto LAB_0045510a;
          uVar11 = uVar11 * 0x10 + (uint)bVar27 + 10;
        }
        flipper.super_BaseProcess._vptr_BaseProcess =
             (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1);
      } while( true );
    }
    uVar23 = uVar11 + 1;
    goto LAB_00455130;
  }
  if ((this->first != 150392.0) || (NAN(this->first))) {
    cVar22 = *(char *)flipper.super_BaseProcess._vptr_BaseProcess;
    dVar5 = -1.0;
    if (0xf5 < (byte)(cVar22 - 0x3aU)) {
      uVar23 = 0;
      pp_Var25 = flipper.super_BaseProcess._vptr_BaseProcess;
      do {
        pp_Var25 = (_func_int **)((long)pp_Var25 + 1);
        uVar23 = (uint)(byte)(cVar22 - 0x30) + uVar23 * 10;
        cVar22 = *(char *)pp_Var25;
      } while (0xf5 < (byte)(cVar22 - 0x3aU));
      dVar5 = (double)uVar23 + -1.0;
    }
    this->first = dVar5;
  }
  goto LAB_0045519b;
LAB_00454d50:
  uVar10 = uVar23 & 0xfffffff;
  uVar23 = uVar11;
LAB_00454d5a:
  local_140 = (ulong)uVar10 << 0x20;
  for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
         (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
      flipper.super_BaseProcess._vptr_BaseProcess =
           (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
  }
  local_128._M_impl._M_node.super__List_node_base._M_prev =
       local_128._M_impl._M_node.super__List_node_base._M_next;
  local_e0._M_prev = &local_e0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&monster_cheat,(char *)flipper.super_BaseProcess._vptr_BaseProcess,
             (allocator<char> *)&lights);
  FindLWOFile((string *)&anims,this,(string *)&monster_cheat);
  if ((ProgressHandler **)monster_cheat.super_BaseProcess._vptr_BaseProcess !=
      &monster_cheat.super_BaseProcess.progress) {
    operator_delete(monster_cheat.super_BaseProcess._vptr_BaseProcess,
                    (ulong)((long)&(monster_cheat.super_BaseProcess.progress)->_vptr_ProgressHandler
                           + 1));
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &attach.
              super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  uVar11 = BatchLoader::AddLoadRequest(&batch,(string *)&anims,0,&props);
  local_140 = CONCAT44(local_140._4_4_,uVar11);
  p_Var15 = std::__cxx11::list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>>::
            _M_create_node<Assimp::LWS::NodeDesc_const&>
                      ((list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>> *)&nodes,
                       (NodeDesc *)&attach);
  std::__detail::_List_node_base::_M_hook(&p_Var15->super__List_node_base);
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node._M_size =
       nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl
       ._M_node._M_size + 1;
  p_Var16 = local_e0._M_next;
  if (anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    p_Var16 = local_e0._M_next;
  }
  while (p_Var16 != &local_e0) {
    p_Var33 = p_Var16->_M_next;
    operator_delete(p_Var16,0x18);
    p_Var16 = p_Var33;
  }
  std::__cxx11::_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::_M_clear
            (&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish != &local_150) {
    operator_delete(attach.
                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    CONCAT71(local_150._1_7_,local_150._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
  ::~_Rb_tree(&props.matrices._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&props.strings._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
  ::~_Rb_tree(&props.floats._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
               *)&props);
  uVar11 = uVar23;
  goto LAB_0045519b;
LAB_00454ff1:
  uVar11 = uVar11 & 0xfffffff;
  for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
         (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
      flipper.super_BaseProcess._vptr_BaseProcess =
           (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
  }
LAB_00455016:
  props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = (ulong)uVar11 << 0x20;
  props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  props.matrices._M_t._M_impl._0_8_ = psVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&anims,(char *)flipper.super_BaseProcess._vptr_BaseProcess,
             (allocator<char> *)&monster_cheat);
  FindLWOFile((string *)&attach,this,(string *)&anims);
  if (anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)anims.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  uVar11 = BatchLoader::AddLoadRequest(&batch,(string *)&attach,0,(PropertyMap *)0x0);
  props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count =
       CONCAT44(props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,uVar11);
  std::__cxx11::string::_M_assign((string *)&props.ints._M_t._M_impl.super__Rb_tree_header);
  p_Var15 = std::__cxx11::list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>>::
            _M_create_node<Assimp::LWS::NodeDesc_const&>
                      ((list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>> *)&nodes,
                       (NodeDesc *)&props);
  std::__detail::_List_node_base::_M_hook(&p_Var15->super__List_node_base);
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node._M_size =
       nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl
       ._M_node._M_size + 1;
  puVar6 = (undefined8 *)props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (attach.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pointer)&attach.
                super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(attach.
                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&(attach.
                                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->scene + 1))
    ;
    puVar6 = (undefined8 *)props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  while (puVar6 != psVar2) {
    puVar4 = (undefined8 *)*puVar6;
    operator_delete(puVar6,0x18);
    puVar6 = puVar4;
  }
  goto LAB_00455172;
LAB_0045510a:
  uVar11 = uVar11 & 0xfffffff;
  for (; (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == ' ' ||
         (*(char *)flipper.super_BaseProcess._vptr_BaseProcess == '\t'));
      flipper.super_BaseProcess._vptr_BaseProcess =
           (_func_int **)((long)flipper.super_BaseProcess._vptr_BaseProcess + 1)) {
  }
LAB_00455130:
  props.ints._M_t._M_impl.super__Rb_tree_header._M_node_count = (ulong)uVar11 << 0x20;
  props.floats._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       flipper.super_BaseProcess._vptr_BaseProcess;
  props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  props.matrices._M_t._M_impl._0_8_ = psVar2;
  p_Var15 = std::__cxx11::list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>>::
            _M_create_node<Assimp::LWS::NodeDesc_const&>
                      ((list<Assimp::LWS::NodeDesc,std::allocator<Assimp::LWS::NodeDesc>> *)&nodes,
                       (NodeDesc *)&props);
  std::__detail::_List_node_base::_M_hook(&p_Var15->super__List_node_base);
  nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl.
  _M_node._M_size =
       nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>._M_impl
       ._M_node._M_size + 1;
  puVar6 = (undefined8 *)props.strings._M_t._M_impl.super__Rb_tree_header._M_node_count;
  while (puVar6 != psVar2) {
    puVar4 = (undefined8 *)*puVar6;
    operator_delete(puVar6,0x18);
    puVar6 = puVar4;
  }
LAB_00455172:
  std::__cxx11::_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_>::_M_clear
            ((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
             &props.floats._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  uVar11 = uVar23;
  if ((_Base_ptr *)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ !=
      &props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    operator_delete((void *)props.ints._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                    (ulong)((long)&(props.ints._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
                                   ->_M_color + 1));
  }
LAB_0045519b:
  p_Var16 = (local_1b8._M_node)->_M_next;
  local_1b8._M_node = p_Var16;
  p_Var7 = nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var33 = nodes.super__List_base<Assimp::LWS::NodeDesc,_std::allocator<Assimp::LWS::NodeDesc>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var16 == (_List_node_base *)&root.children) goto joined_r0x00455c3f;
  goto LAB_004546f9;
}

Assistant:

void LWSImporter::InternReadFile( const std::string& pFile, aiScene* pScene,
    IOSystem* pIOHandler)
{
    io = pIOHandler;
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open LWS file " + pFile + ".");
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    std::vector< char > mBuffer;
    TextFileToBuffer(file.get(),mBuffer);

    // Parse the file structure
    LWS::Element root; const char* dummy = &mBuffer[0];
    root.Parse(dummy);

    // Construct a Batchimporter to read more files recursively
    BatchLoader batch(pIOHandler);
//  batch.SetBasePath(pFile);

    // Construct an array to receive the flat output graph
    std::list<LWS::NodeDesc> nodes;

    unsigned int cur_light = 0, cur_camera = 0, cur_object = 0;
    unsigned int num_light = 0, num_camera = 0, num_object = 0;

    // check magic identifier, 'LWSC'
    bool motion_file = false;
    std::list< LWS::Element >::const_iterator it = root.children.begin();

    if ((*it).tokens[0] == "LWMO")
        motion_file = true;

    if ((*it).tokens[0] != "LWSC" && !motion_file)
        throw DeadlyImportError("LWS: Not a LightWave scene, magic tag LWSC not found");

    // get file format version and print to log
    ++it;
    unsigned int version = strtoul10((*it).tokens[0].c_str());
    ASSIMP_LOG_INFO("LWS file format version is " + (*it).tokens[0]);
    first = 0.;
    last  = 60.;
    fps   = 25.; /* seems to be a good default frame rate */

    // Now read all elements in a very straghtforward manner
    for (; it != root.children.end(); ++it) {
        const char* c = (*it).tokens[1].c_str();

        // 'FirstFrame': begin of animation slice
        if ((*it).tokens[0] == "FirstFrame") {
            if (150392. != first           /* see SetupProperties() */)
                first = strtoul10(c,&c)-1.; /* we're zero-based */
        }

        // 'LastFrame': end of animation slice
        else if ((*it).tokens[0] == "LastFrame") {
            if (150392. != last      /* see SetupProperties() */)
                last = strtoul10(c,&c)-1.; /* we're zero-based */
        }

        // 'FramesPerSecond': frames per second
        else if ((*it).tokens[0] == "FramesPerSecond") {
            fps = strtoul10(c,&c);
        }

        // 'LoadObjectLayer': load a layer of a specific LWO file
        else if ((*it).tokens[0] == "LoadObjectLayer") {

            // get layer index
            const int layer = strtoul10(c,&c);

            // setup the layer to be loaded
            BatchLoader::PropertyMap props;
            SetGenericProperty(props.ints,AI_CONFIG_IMPORT_LWO_ONE_LAYER_ONLY,layer);

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;
            if (version >= 4) { // handle LWSC 4 explicit ID
                SkipSpaces(&c);
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_object++;

            // and add the file to the import list
            SkipSpaces(&c);
            std::string path = FindLWOFile( c );
            d.path = path;
            d.id = batch.AddLoadRequest(path,0,&props);

            nodes.push_back(d);
            num_object++;
        }
        // 'LoadObject': load a LWO file into the scenegraph
        else if ((*it).tokens[0] == "LoadObject") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
                SkipSpaces(&c);
            }
            else d.number = cur_object++;
            std::string path = FindLWOFile( c );
            d.id = batch.AddLoadRequest(path,0,NULL);

            d.path = path;
            nodes.push_back(d);
            num_object++;
        }
        // 'AddNullObject': add a dummy node to the hierarchy
        else if ((*it).tokens[0] == "AddNullObject") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::OBJECT;
            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
                SkipSpaces(&c);
            }
            else d.number = cur_object++;
            d.name = c;
            nodes.push_back(d);

            num_object++;
        }
        // 'NumChannels': Number of envelope channels assigned to last layer
        else if ((*it).tokens[0] == "NumChannels") {
            // ignore for now
        }
        // 'Channel': preceedes any envelope description
        else if ((*it).tokens[0] == "Channel") {
            if (nodes.empty()) {
                if (motion_file) {

                    // LightWave motion file. Add dummy node
                    LWS::NodeDesc d;
                    d.type = LWS::NodeDesc::OBJECT;
                    d.name = c;
                    d.number = cur_object++;
                    nodes.push_back(d);
                }
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Channel\'");
            }

            // important: index of channel
            nodes.back().channels.push_back(LWO::Envelope());
            LWO::Envelope& env = nodes.back().channels.back();

            env.index = strtoul10(c);

            // currently we can just interpret the standard channels 0...9
            // (hack) assume that index-i yields the binary channel type from LWO
            env.type = (LWO::EnvelopeType)(env.index+1);

        }
        // 'Envelope': a single animation channel
        else if ((*it).tokens[0] == "Envelope") {
            if (nodes.empty() || nodes.back().channels.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Envelope\'");
            else {
                ReadEnvelope((*it),nodes.back().channels.back());
            }
        }
        // 'ObjectMotion': animation information for older lightwave formats
        else if (version < 3  && ((*it).tokens[0] == "ObjectMotion" ||
            (*it).tokens[0] == "CameraMotion" ||
            (*it).tokens[0] == "LightMotion")) {

            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'<Light|Object|Camera>Motion\'");
            else {
                ReadEnvelope_Old(it,root.children.end(),nodes.back(),version);
            }
        }
        // 'Pre/PostBehavior': pre/post animation behaviour for LWSC 2
        else if (version == 2 && (*it).tokens[0] == "Pre/PostBehavior") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'Pre/PostBehavior'");
            else {
                for (std::list<LWO::Envelope>::iterator it = nodes.back().channels.begin(); it != nodes.back().channels.end(); ++it) {
                    // two ints per envelope
                    LWO::Envelope& env = *it;
                    env.pre  = (LWO::PrePostBehaviour) strtoul10(c,&c); SkipSpaces(&c);
                    env.post = (LWO::PrePostBehaviour) strtoul10(c,&c); SkipSpaces(&c);
                }
            }
        }
        // 'ParentItem': specifies the parent of the current element
        else if ((*it).tokens[0] == "ParentItem") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'ParentItem\'");

            else nodes.back().parent = strtoul16(c,&c);
        }
        // 'ParentObject': deprecated one for older formats
        else if (version < 3 && (*it).tokens[0] == "ParentObject") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'ParentObject\'");

            else {
                nodes.back().parent = strtoul10(c,&c) | (1u << 28u);
            }
        }
        // 'AddCamera': add a camera to the scenegraph
        else if ((*it).tokens[0] == "AddCamera") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::CAMERA;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_camera++;
            nodes.push_back(d);

            num_camera++;
        }
        // 'CameraName': set name of currently active camera
        else if ((*it).tokens[0] == "CameraName") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::CAMERA)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'CameraName\'");

            else nodes.back().name = c;
        }
        // 'AddLight': add a light to the scenegraph
        else if ((*it).tokens[0] == "AddLight") {

            // add node to list
            LWS::NodeDesc d;
            d.type = LWS::NodeDesc::LIGHT;

            if (version >= 4) { // handle LWSC 4 explicit ID
                d.number = strtoul16(c,&c) & AI_LWS_MASK;
            }
            else d.number = cur_light++;
            nodes.push_back(d);

            num_light++;
        }
        // 'LightName': set name of currently active light
        else if ((*it).tokens[0] == "LightName") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightName\'");

            else nodes.back().name = c;
        }
        // 'LightIntensity': set intensity of currently active light
        else if ((*it).tokens[0] == "LightIntensity" || (*it).tokens[0] == "LgtIntensity" ) {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightIntensity\'");

            else fast_atoreal_move<float>(c, nodes.back().lightIntensity );

        }
        // 'LightType': set type of currently active light
        else if ((*it).tokens[0] == "LightType") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightType\'");

            else nodes.back().lightType = strtoul10(c);

        }
        // 'LightFalloffType': set falloff type of currently active light
        else if ((*it).tokens[0] == "LightFalloffType") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightFalloffType\'");

            else nodes.back().lightFalloffType = strtoul10(c);

        }
        // 'LightConeAngle': set cone angle of currently active light
        else if ((*it).tokens[0] == "LightConeAngle") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightConeAngle\'");

            else nodes.back().lightConeAngle = fast_atof(c);

        }
        // 'LightEdgeAngle': set area where we're smoothing from min to max intensity
        else if ((*it).tokens[0] == "LightEdgeAngle") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightEdgeAngle\'");

            else nodes.back().lightEdgeAngle = fast_atof(c);

        }
        // 'LightColor': set color of currently active light
        else if ((*it).tokens[0] == "LightColor") {
            if (nodes.empty() || nodes.back().type != LWS::NodeDesc::LIGHT)
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'LightColor\'");

            else {
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.r );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.g );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().lightColor.b );
            }
        }

        // 'PivotPosition': position of local transformation origin
        else if ((*it).tokens[0] == "PivotPosition" || (*it).tokens[0] == "PivotPoint") {
            if (nodes.empty())
                ASSIMP_LOG_ERROR("LWS: Unexpected keyword: \'PivotPosition\'");
            else {
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.x );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.y );
                SkipSpaces(&c);
                c = fast_atoreal_move<float>(c, (float&) nodes.back().pivotPos.z );
                // Mark pivotPos as set
                nodes.back().isPivotSet = true;
            }
        }
    }

    // resolve parenting
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {

        // check whether there is another node which calls us a parent
        for (std::list<LWS::NodeDesc>::iterator dit = nodes.begin(); dit != nodes.end(); ++dit) {
            if (dit != it && *it == (*dit).parent) {
                if ((*dit).parent_resolved) {
                    // fixme: it's still possible to produce an overflow due to cross references ..
                    ASSIMP_LOG_ERROR("LWS: Found cross reference in scene-graph");
                    continue;
                }

                (*it).children.push_back(&*dit);
                (*dit).parent_resolved = &*it;
            }
        }
    }

    // find out how many nodes have no parent yet
    unsigned int no_parent = 0;
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
        if (!(*it).parent_resolved)
            ++ no_parent;
    }
    if (!no_parent)
        throw DeadlyImportError("LWS: Unable to find scene root node");


    // Load all subsequent files
    batch.LoadAll();

    // and build the final output graph by attaching the loaded external
    // files to ourselves. first build a master graph
    aiScene* master = new aiScene();
    aiNode* nd = master->mRootNode = new aiNode();

    // allocate storage for cameras&lights
    if (num_camera) {
        master->mCameras = new aiCamera*[master->mNumCameras = num_camera];
    }
    aiCamera** cams = master->mCameras;
    if (num_light) {
        master->mLights = new aiLight*[master->mNumLights = num_light];
    }
    aiLight** lights = master->mLights;

    std::vector<AttachmentInfo> attach;
    std::vector<aiNodeAnim*> anims;

    nd->mName.Set("<LWSRoot>");
    nd->mChildren = new aiNode*[no_parent];
    for (std::list<LWS::NodeDesc>::iterator it = nodes.begin(); it != nodes.end(); ++it) {
        if (!(*it).parent_resolved) {
            aiNode* ro = nd->mChildren[ nd->mNumChildren++ ] = new aiNode();
            ro->mParent = nd;

            // ... and build the scene graph. If we encounter object nodes,
            // add then to our attachment table.
            BuildGraph(ro,*it, attach, batch, cams, lights, anims);
        }
    }

    // create a master animation channel for us
    if (anims.size()) {
        master->mAnimations = new aiAnimation*[master->mNumAnimations = 1];
        aiAnimation* anim = master->mAnimations[0] = new aiAnimation();
        anim->mName.Set("LWSMasterAnim");

        // LWS uses seconds as time units, but we convert to frames
        anim->mTicksPerSecond = fps;
        anim->mDuration = last-(first-1); /* fixme ... zero or one-based?*/

        anim->mChannels = new aiNodeAnim*[anim->mNumChannels = static_cast<unsigned int>(anims.size())];
        std::copy(anims.begin(),anims.end(),anim->mChannels);
    }

    // convert the master scene to RH
    MakeLeftHandedProcess monster_cheat;
    monster_cheat.Execute(master);

    // .. ccw
    FlipWindingOrderProcess flipper;
    flipper.Execute(master);

    // OK ... finally build the output graph
    SceneCombiner::MergeScenes(&pScene,master,attach,
        AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES    | (!configSpeedFlag ? (
        AI_INT_MERGE_SCENE_GEN_UNIQUE_NAMES_IF_NECESSARY | AI_INT_MERGE_SCENE_GEN_UNIQUE_MATNAMES) : 0));

    // Check flags
    if (!pScene->mNumMeshes || !pScene->mNumMaterials) {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;

        if (pScene->mNumAnimations && !noSkeletonMesh) {
            // construct skeleton mesh
            SkeletonMeshBuilder builder(pScene);
        }
    }

}